

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle.cpp
# Opt level: O0

int beagleRemoveScaleFactors(int instance,int *scalingIndices,int count,int cumulativeScalingIndex)

{
  BeagleImpl *pBVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  int returnValue;
  BeagleImpl *beagleInstance;
  int in_stack_ffffffffffffffdc;
  undefined4 local_4;
  
  pBVar1 = beagle::getBeagleInstance(in_stack_ffffffffffffffdc);
  if (pBVar1 == (BeagleImpl *)0x0) {
    local_4 = -4;
  }
  else {
    local_4 = (**(code **)(*(long *)pBVar1 + 0x110))(pBVar1,in_RSI,in_EDX,in_ECX);
  }
  return local_4;
}

Assistant:

int beagleRemoveScaleFactors(int instance,
                           const int* scalingIndices,
                           int count,
                           int cumulativeScalingIndex) {
    DEBUG_START_TIME();
//    try {
        beagle::BeagleImpl* beagleInstance = beagle::getBeagleInstance(instance);
        if (beagleInstance == NULL)
            return BEAGLE_ERROR_UNINITIALIZED_INSTANCE;
        int returnValue = beagleInstance->removeScaleFactors(scalingIndices, count, cumulativeScalingIndex);
        DEBUG_END_TIME();
        return returnValue;
//    }
//    catch (std::bad_alloc &) {
//        return BEAGLE_ERROR_OUT_OF_MEMORY;
//    }
//    catch (std::out_of_range &) {
//        return BEAGLE_ERROR_OUT_OF_RANGE;
//    }
//    catch (...) {
//        return BEAGLE_ERROR_UNIDENTIFIED_EXCEPTION;
//    }
}